

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> * __thiscall
frozen::bits::pmh_buckets<8UL>::get_sorted_buckets
          (carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *__return_storage_ptr__,
          pmh_buckets<8UL> *this)

{
  iterator left;
  iterator pvVar1;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *result;
  bucket_size_compare local_12 [2];
  pmh_buckets<8UL> *local_10;
  pmh_buckets<8UL> *this_local;
  
  local_10 = this;
  pmh_buckets<8ul>::make_bucket_refs<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(__return_storage_ptr__,this);
  left = carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL>::begin(__return_storage_ptr__);
  pvVar1 = carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL>::end(__return_storage_ptr__);
  quicksort<frozen::bits::pmh_buckets<8ul>::bucket_ref*,frozen::bits::bucket_size_compare>
            (left,pvVar1 + -1,local_12);
  return __return_storage_ptr__;
}

Assistant:

carray<bucket_ref, M> constexpr get_sorted_buckets() const {
    carray<bucket_ref, M> result{this->make_bucket_refs(std::make_index_sequence<M>())};
    bits::quicksort(result.begin(), result.end() - 1, bucket_size_compare{});
    return result;
  }